

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtalk.c
# Opt level: O2

void openjtalk_clearHTSVoiceList(OpenJTalk *oj,HtsVoiceFilelist *list)

{
  HtsVoiceFilelist *__ptr;
  
  if (oj == (OpenJTalk *)0x0) {
    g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
  }
  else {
    __ptr = (HtsVoiceFilelist *)0x0;
    while( true ) {
      free(__ptr);
      if (list == (HtsVoiceFilelist *)0x0) break;
      if ((list->field_1).pathSjis != (char *)0x0) {
        *(list->field_1).pathSjis = '\0';
      }
      if ((list->field_2).nameSjis != (char *)0x0) {
        *(list->field_2).nameSjis = '\0';
      }
      free((list->field_1).pathSjis);
      free((list->field_2).nameSjis);
      __ptr = list;
      list = list->succ;
    }
  }
  return;
}

Assistant:

OPENJTALK_CONVENTION openjtalk_clearHTSVoiceList(OpenJTalk *oj, HtsVoiceFilelist *list)
{
	if (!oj)
	{
		g_lastError = OPENJTALKERROR_OBJECT_POINTER_IS_NULL;
		return;
	}

	HtsVoiceFilelist *prev = NULL;

	while (list != NULL)
	{
		if (prev != NULL)
		{
			free(prev);
		}

		if (list->path)
		{
			list->path[0] = '\0';
		}
		if (list->name)
		{
			list->name[0] = '\0';
		}

		if (list->path)
		{
			free(list->path);
		}
		if (list->name)
		{
			free(list->name);
		}

		prev = list;
		list = list->succ;
	}

	if (prev != NULL)
	{
		free(prev);
	}
}